

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bulk.c
# Opt level: O3

void ecs_bulk_add_type(ecs_world_t *world,ecs_type_t to_add,ecs_filter_t *filter)

{
  ecs_sparse_t *peVar1;
  bool condition;
  long lVar2;
  undefined8 uVar3;
  _Bool _Var4;
  int32_t iVar5;
  ecs_stage_t *peVar6;
  ecs_table_t *table;
  ecs_table_t *dst_table;
  int dense_index;
  ecs_entities_t eVar7;
  code *pcStack_60;
  undefined1 local_58 [8];
  ecs_entities_t to_add_array;
  ecs_entities_t added;
  ecs_world_t *world_local;
  
  pcStack_60 = (code *)0x131916;
  added._8_8_ = world;
  _ecs_assert(world != (ecs_world_t *)0x0,2,(char *)0x0,"world != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
              ,0xa2);
  if (world == (ecs_world_t *)0x0) {
    pcStack_60 = (code *)0x131b3e;
    __assert_fail("world != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                  ,0xa2,"void ecs_bulk_add_type(ecs_world_t *, ecs_type_t, const ecs_filter_t *)");
  }
  pcStack_60 = (code *)0x131948;
  _ecs_assert(to_add != (ecs_type_t)0x0,2,(char *)0x0,"to_add != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
              ,0xa3);
  if (to_add != (ecs_type_t)0x0) {
    pcStack_60 = (code *)0x13195d;
    peVar6 = ecs_get_stage((ecs_world_t **)&added.count);
    pcStack_60 = (code *)0x131995;
    _ecs_assert(peVar6 == (ecs_stage_t *)(added._8_8_ + 0x5b08),0x23,(char *)0x0,
                "stage == &world->stage",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                ,0xa6);
    if (peVar6 != (ecs_stage_t *)(added._8_8_ + 0x5b08)) {
      pcStack_60 = ecs_bulk_add_entity;
      __assert_fail("stage == &world->stage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                    ,0xa6,"void ecs_bulk_add_type(ecs_world_t *, ecs_type_t, const ecs_filter_t *)")
      ;
    }
    pcStack_60 = (code *)0x1319a9;
    eVar7 = ecs_type_to_entities(to_add);
    local_58 = (undefined1  [8])eVar7.array;
    to_add_array.array._0_4_ = eVar7.count;
    lVar2 = -((long)((int)to_add_array.array << 3) + 0xfU & 0xfffffffffffffff0);
    to_add_array._8_8_ = local_58 + lVar2;
    added.array._0_4_ = 0;
    peVar1 = *(ecs_sparse_t **)(added._8_8_ + 0x4830);
    *(undefined8 *)((long)&pcStack_60 + lVar2) = 0x1319e2;
    iVar5 = ecs_sparse_count(peVar1);
    if (0 < iVar5) {
      dense_index = 0;
      do {
        peVar1 = *(ecs_sparse_t **)(added._8_8_ + 0x4830);
        *(undefined8 *)((long)&pcStack_60 + lVar2) = 0x131a08;
        table = (ecs_table_t *)_ecs_sparse_get(peVar1,0x80,dense_index);
        uVar3 = added._8_8_;
        if ((table->flags & 1) == 0) {
          *(undefined8 *)((long)&pcStack_60 + lVar2) = 0x131a24;
          _Var4 = ecs_table_match_filter((ecs_world_t *)uVar3,table,filter);
          uVar3 = added._8_8_;
          if (_Var4) {
            *(undefined8 *)((long)&pcStack_60 + lVar2) = 0x131a40;
            dst_table = ecs_table_traverse_add
                                  ((ecs_world_t *)uVar3,table,(ecs_entities_t *)local_58,
                                   (ecs_entities_t *)&to_add_array.count);
            condition = (int)added.array <= (int)to_add_array.array;
            *(undefined8 *)((long)&pcStack_60 + lVar2) = 0x131a6f;
            _ecs_assert(condition,0xc,(char *)0x0,"added.count <= to_add_array.count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                        ,0xbe);
            if ((int)to_add_array.array < (int)added.array) {
              *(undefined8 *)((long)&pcStack_60 + lVar2) = 0x131b00;
              __assert_fail("added.count <= to_add_array.count",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                            ,0xbe,
                            "void ecs_bulk_add_type(ecs_world_t *, ecs_type_t, const ecs_filter_t *)"
                           );
            }
            if ((int)added.array != 0) {
              *(undefined8 *)((long)&pcStack_60 + lVar2) = 0x131aa4;
              _ecs_assert(dst_table != (ecs_table_t *)0x0,0xc,(char *)0x0,"dst_table != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                          ,0xc4);
              uVar3 = added._8_8_;
              if (dst_table == (ecs_table_t *)0x0) {
                *(undefined8 *)((long)&pcStack_60 + lVar2) = 0x131b1f;
                __assert_fail("dst_table != ((void*)0)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                              ,0xc4,
                              "void ecs_bulk_add_type(ecs_world_t *, ecs_type_t, const ecs_filter_t *)"
                             );
              }
              *(undefined8 *)((long)&pcStack_60 + lVar2) = 0x131abf;
              merge_table((ecs_world_t *)uVar3,dst_table,table,(ecs_entities_t *)&to_add_array.count
                          ,(ecs_entities_t *)0x0);
              added.array._0_4_ = 0;
            }
          }
        }
        dense_index = dense_index + 1;
      } while (iVar5 != dense_index);
    }
    return;
  }
  pcStack_60 = (code *)0x131b5d;
  __assert_fail("to_add != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                ,0xa3,"void ecs_bulk_add_type(ecs_world_t *, ecs_type_t, const ecs_filter_t *)");
}

Assistant:

void ecs_bulk_add_type(
    ecs_world_t *world,
    ecs_type_t to_add,
    const ecs_filter_t *filter)
{
    ecs_assert(world != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_assert(to_add != NULL, ECS_INVALID_PARAMETER, NULL);
    
    ecs_stage_t *stage = ecs_get_stage(&world);
    ecs_assert(stage == &world->stage, ECS_UNSUPPORTED, NULL);
    (void)stage;

    ecs_entities_t to_add_array = ecs_type_to_entities(to_add);
    ecs_entities_t added = {
        .array = ecs_os_alloca(ECS_SIZEOF(ecs_entity_t) * to_add_array.count),
        .count = 0
    };

    int32_t i, count = ecs_sparse_count(world->store.tables);
    for (i = 0; i < count; i ++) {
        ecs_table_t *table = ecs_sparse_get(world->store.tables, ecs_table_t, i);

        if (table->flags & EcsTableHasBuiltins) {
            continue;
        }

        if (!ecs_table_match_filter(world, table, filter)) {
            continue;
        }
        
        ecs_table_t *dst_table = ecs_table_traverse_add(
            world, table, &to_add_array, &added);
        
        ecs_assert(added.count <= to_add_array.count, ECS_INTERNAL_ERROR, NULL);

        if (!added.count) {
            continue;
        }

        ecs_assert(dst_table != NULL, ECS_INTERNAL_ERROR, NULL);
        merge_table(world, dst_table, table, &added, NULL);
        added.count = 0;
    }    
}